

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

iterator __thiscall
r_code::list<r_exec::MDLController::REntry>::erase
          (list<r_exec::MDLController::REntry> *this,iterator *i)

{
  iterator iVar1;
  
  iVar1.super__iterator._cell = _erase(this,(i->super__iterator)._cell);
  iVar1._list = this;
  return iVar1;
}

Assistant:

iterator erase(iterator &i)
    {
        return iterator(this, _erase(i._cell)); // no check for i._cell==null.
    }